

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O0

void __thiscall
icu_63::number::FormattedNumber::getAllFieldPositionsImpl
          (FormattedNumber *this,FieldPositionIteratorHandler *fpih,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  FieldPositionIteratorHandler *fpih_local;
  FormattedNumber *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (this->fResults == (UFormattedNumberData *)0x0) {
      *status = this->fErrorCode;
    }
    else {
      impl::NumberStringBuilder::getAllFieldPositions(&this->fResults->string,fpih,status);
    }
  }
  return;
}

Assistant:

void FormattedNumber::getAllFieldPositionsImpl(FieldPositionIteratorHandler& fpih,
                                               UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    if (fResults == nullptr) {
        status = fErrorCode;
        return;
    }
    fResults->string.getAllFieldPositions(fpih, status);
}